

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueResult::Reset(StringValueResult *this)

{
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *this_00;
  ulong *puVar1;
  pointer ppVVar2;
  ValidityMask *pVVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  idx_t iVar7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  mapped_type *pmVar11;
  CSVBufferHandle *pCVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  ValidityMask **v;
  pointer ppVVar15;
  idx_t iVar16;
  ulong uVar17;
  shared_ptr<duckdb::CSVBufferHandle,_true> cur_buffer;
  shared_ptr<duckdb::CSVBufferHandle,_true> local_48;
  _Head_base<0UL,_unsigned_long_*,_false> local_38;
  
  if (this->number_of_rows != 0) {
    this->chunk_col_id = 0;
    this->number_of_rows = 0;
    this->cur_col_id = 0;
    ppVVar2 = (this->validity_mask).
              super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
              super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppVVar15 = (this->validity_mask).
                    super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                    super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVVar15 != ppVVar2;
        ppVVar15 = ppVVar15 + 1) {
      pVVar3 = *ppVVar15;
      uVar4 = (this->super_ScannerResult).result_size;
      if ((pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
         ) {
        local_38._M_head_impl =
             (unsigned_long *)(pVVar3->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_48,(unsigned_long *)&local_38);
        _Var9._M_pi = local_48.internal.
                      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar8 = local_48.internal.
                 super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)peVar8;
        (pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = _Var9._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if (local_48.internal.
            super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.internal.
                     super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_data);
        (pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar10->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      if (uVar4 != 0) {
        uVar17 = uVar4 + 0x3f >> 6;
        if (uVar17 != 1) {
          switchD_01306cb1::default
                    ((pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask,0xff,
                     uVar17 * 8 - 8);
        }
        puVar1 = (pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar17 - 1);
        *puVar1 = *puVar1 | -(ulong)((uVar4 & 0x3f) == 0) | ~(-1L << ((byte)uVar4 & 0x3f));
      }
    }
    local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (_Hash_node_base *)(this->iterator->pos).buffer_idx;
    uVar4 = (this->buffer_handles)._M_h._M_bucket_count;
    uVar17 = (ulong)p_Var5 % uVar4;
    p_Var13 = (this->buffer_handles)._M_h._M_buckets[uVar17];
    p_Var14 = (__node_base_ptr)0x0;
    if ((p_Var13 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var13->_M_nxt, p_Var14 = p_Var13, p_Var5 != p_Var13->_M_nxt[1]._M_nxt)) {
      while (p_Var13 = p_Var6, p_Var6 = p_Var13->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var14 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar4 != uVar17) ||
           (p_Var14 = p_Var13, p_Var5 == p_Var6[1]._M_nxt)) goto LAB_0150ce40;
      }
      p_Var14 = (__node_base_ptr)0x0;
    }
LAB_0150ce40:
    this_00 = &this->buffer_handles;
    if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0)) {
      local_38._M_head_impl = (unsigned_long *)(this->iterator->pos).buffer_idx;
      pmVar11 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)&local_38);
      shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(&local_48,pmVar11);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&this_00->_M_h);
    if (local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      iVar16 = 0;
    }
    else {
      pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&local_48);
      pmVar11 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,&pCVar12->buffer_idx);
      shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(pmVar11,&local_48);
      pCVar12 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&local_48);
      iVar16 = pCVar12->actual_size;
    }
    ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::clear
              ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)
               &this->current_errors);
    (this->current_errors).is_error_in_line = false;
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&(this->borked_rows)._M_h);
    iVar7 = (this->iterator->pos).buffer_idx;
    (this->current_line_position).begin.buffer_pos = (this->iterator->pos).buffer_pos;
    (this->current_line_position).begin.buffer_size = iVar16;
    (this->current_line_position).begin.buffer_idx = iVar7;
    (this->current_line_position).end.buffer_idx = iVar7;
    (this->current_line_position).end.buffer_pos = (this->current_line_position).begin.buffer_pos;
    (this->current_line_position).end.buffer_size = (this->current_line_position).begin.buffer_size;
    if (local_48.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.internal.
                 super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  return;
}

Assistant:

void StringValueResult::Reset() {
	if (number_of_rows == 0) {
		return;
	}
	number_of_rows = 0;
	cur_col_id = 0;
	chunk_col_id = 0;
	for (auto &v : validity_mask) {
		v->SetAllValid(result_size);
	}
	// We keep a reference to the buffer from our current iteration if it already exists
	shared_ptr<CSVBufferHandle> cur_buffer;
	if (buffer_handles.find(iterator.GetBufferIdx()) != buffer_handles.end()) {
		cur_buffer = buffer_handles[iterator.GetBufferIdx()];
	}
	buffer_handles.clear();
	idx_t actual_size = 0;
	if (cur_buffer) {
		buffer_handles[cur_buffer->buffer_idx] = cur_buffer;
		actual_size = cur_buffer->actual_size;
	}
	current_errors.Reset();
	borked_rows.clear();
	current_line_position.begin = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, actual_size};
	current_line_position.end = current_line_position.begin;
}